

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_align_byte(bitstream *str,vs_align_byte_mode mode)

{
  int iVar1;
  uint32_t tmp;
  
  if (mode != VS_ALIGN_0) {
    if (mode == VS_ALIGN_10) {
      mode = 1 << ((byte)str->bitpos & 0x1f);
    }
    else {
      if (mode != VS_ALIGN_1) {
        abort();
      }
      mode = ~(-1 << ((char)str->bitpos + 1U & 0x1f));
    }
  }
  if (str->dir == VS_ENCODE) {
    if (str->bitpos != 7) {
      str->curbyte = str->curbyte | (byte)mode;
      iVar1 = vs_byte(str);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else {
    if (str->hasbyte != 0) {
      iVar1 = vs_u(str,&tmp,str->bitpos + 1);
      if (iVar1 != 0) {
        return 1;
      }
      if (tmp != mode) {
        fwrite("Byte alignment bits don\'t match!\n",0x21,1,_stderr);
        return 1;
      }
    }
    str->hasbyte = 0;
    str->bitpos = 7;
  }
  return 0;
}

Assistant:

int vs_align_byte(struct bitstream *str, enum vs_align_byte_mode mode) {
	uint32_t pad;
	switch (mode) {
		case VS_ALIGN_0:
			pad = 0;
			break;
		case VS_ALIGN_1:
			pad = (1 << (str->bitpos + 1)) - 1;
			break;
		case VS_ALIGN_10:
			pad = 1 << str->bitpos;
			break;
		default:
			abort();
	}
	if (str->dir == VS_ENCODE) {
		if (str->bitpos != 7) {
			str->curbyte |= pad;
			if (vs_byte(str))
				return 1;
		}
	} else {
		if (str->hasbyte) {
			uint32_t tmp;
			if (vs_u(str, &tmp, str->bitpos + 1))
				return 1;
			if (tmp != pad) {
				fprintf(stderr, "Byte alignment bits don't match!\n");
				return 1;
			}
		}
		str->hasbyte = 0;
		str->bitpos = 7;
	}
	return 0;
}